

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PackageExportAllDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,PackageExportAllDeclarationSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *local_90;
  size_t index_local;
  PackageExportAllDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_90 = (SyntaxNode *)0x0;
    if (this != (PackageExportAllDeclarationSyntax *)0xfffffffffffffff0) {
      local_90 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 1:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->star1).kind;
    token_00._2_1_ = (this->star1).field_0x2;
    token_00.numFlags.raw = (this->star1).numFlags.raw;
    token_00.rawLen = (this->star1).rawLen;
    token_00.info = (this->star1).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->doubleColon).kind;
    token_01._2_1_ = (this->doubleColon).field_0x2;
    token_01.numFlags.raw = (this->doubleColon).numFlags.raw;
    token_01.rawLen = (this->doubleColon).rawLen;
    token_01.info = (this->doubleColon).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    token_02.kind = (this->star2).kind;
    token_02._2_1_ = (this->star2).field_0x2;
    token_02.numFlags.raw = (this->star2).numFlags.raw;
    token_02.rawLen = (this->star2).rawLen;
    token_02.info = (this->star2).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 5:
    token_03.kind = (this->semi).kind;
    token_03._2_1_ = (this->semi).field_0x2;
    token_03.numFlags.raw = (this->semi).numFlags.raw;
    token_03.rawLen = (this->semi).rawLen;
    token_03.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax PackageExportAllDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return star1;
        case 3: return doubleColon;
        case 4: return star2;
        case 5: return semi;
        default: return nullptr;
    }
}